

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void default_reply_full_name(SftpReplyBuilder *reply,ptrlen name,ptrlen longname,fxp_attrs attrs)

{
  SftpReplyBuilderVtable *pSVar1;
  
  pSVar1 = reply[1].vt;
  *(undefined4 *)&pSVar1->reply_full_name = 0x68;
  BinarySink_put_stringpl((BinarySink *)&pSVar1->reply_handle,name);
  BinarySink_put_stringpl((BinarySink *)&(reply[1].vt)->reply_handle,longname);
  BinarySink_put_fxp_attrs((BinarySink *)&(reply[1].vt)->reply_handle,attrs);
  return;
}

Assistant:

static void default_reply_full_name(SftpReplyBuilder *reply, ptrlen name,
                                    ptrlen longname, struct fxp_attrs attrs)
{
    DefaultSftpReplyBuilder *d =
        container_of(reply, DefaultSftpReplyBuilder, rb);
    d->pkt->type = SSH_FXP_NAME;
    put_stringpl(d->pkt, name);
    put_stringpl(d->pkt, longname);
    put_fxp_attrs(d->pkt, attrs);
}